

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuSloppyState::timeout(QMenuSloppyState *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  QObject *pQVar4;
  byte bVar5;
  QAction *pQVar6;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->m_menu->super_QWidget).field_0x8;
  bVar5 = (this_00->field_0x420 & 0x40) >> 6;
  if (bVar5 == 0) {
    local_30 = QGuiApplicationPrivate::QLastCursorPosition::toPoint();
    local_40 = (undefined1  [16])QWidget::frameGeometry(&this->m_menu->super_QWidget);
    bVar5 = QRect::contains((QPoint *)local_40,SUB81(&local_30,0));
  }
  pQVar6 = this_00->currentAction;
  if (((pQVar6 != (QAction *)0x0 && pQVar6 == this->m_reset_action) & bVar5) == 1) {
    pQVar3 = (QObject *)QAction::menu<QMenu*>(pQVar6);
    pDVar1 = (this_00->activeMenu).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_00->activeMenu).wp.value;
    }
    if (pQVar4 == pQVar3) goto LAB_0042122e;
  }
  local_40._8_8_ = &this->m_init_guard;
  local_40._0_8_ = this;
  this->m_init_guard = false;
  bVar2 = hasParentActiveDelayTimer(this);
  if ((!bVar2) && ((((this->m_menu->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->m_sub_menu);
    if (bVar2) {
      pDVar1 = (this->m_sub_menu).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this->m_sub_menu).wp.value;
      }
      QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar3);
    }
    if (bVar5 == 0) {
      pQVar6 = (QAction *)0x0;
    }
    else {
      if ((this->field_0x6c & 0x20) == 0) goto LAB_00421224;
      pQVar6 = this->m_reset_action;
    }
    QMenuPrivate::setCurrentAction(this_00,pQVar6,0,SelectedFromElsewhere,false);
  }
LAB_00421224:
  ResetOnDestroy::~ResetOnDestroy((ResetOnDestroy *)local_40);
LAB_0042122e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuSloppyState::timeout()
{
    QMenuPrivate *menu_priv = QMenuPrivate::get(m_menu);

    bool reallyHasMouse = menu_priv->hasReceievedEnter;
    if (!reallyHasMouse) {
        // Check whether the menu really has a mouse, because only active popup
        // menu gets the enter/leave events. Currently Cocoa is an exception.
        const QPoint lastCursorPos = QGuiApplicationPrivate::lastCursorPosition.toPoint();
        reallyHasMouse = m_menu->frameGeometry().contains(lastCursorPos);
    }

    if (menu_priv->currentAction == m_reset_action
            && reallyHasMouse
            && (menu_priv->currentAction
                && menu_priv->currentAction->menu() == menu_priv->activeMenu)) {
        return;
    }

    ResetOnDestroy resetState(this, &m_init_guard);

    if (hasParentActiveDelayTimer() || !m_menu->isVisible())
        return;

    if (m_sub_menu)
        menu_priv->hideMenu(m_sub_menu);

    if (reallyHasMouse) {
        if (m_use_reset_action)
            menu_priv->setCurrentAction(m_reset_action, 0);
    } else {
        menu_priv->setCurrentAction(nullptr, 0);
    }
}